

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dict.cpp
# Opt level: O2

int __thiscall dic::rehash(dic *this,int dictidx)

{
  unsigned_long uVar1;
  long lVar2;
  dictEntry *pdVar3;
  uint uVar4;
  ulong uVar5;
  void *pvVar6;
  long lVar7;
  long *plVar8;
  long lVar9;
  void *key;
  int iVar10;
  int dictidx_00;
  dictht *ht;
  dictEntry *pdVar11;
  dic *this_00;
  uint uVar12;
  dictEntry **ppdVar13;
  pointer pdVar14;
  double dVar15;
  
  pdVar14 = (this->dc).super__Vector_base<dict,_std::allocator<dict>_>._M_impl.
            super__Vector_impl_data._M_start;
  (pdVar14[dictidx].type)->hashFunction = murmurhash2;
  uVar1 = pdVar14[dictidx].ht[0].size;
  dVar15 = 2.0;
  iVar10 = 2;
  while (uVar5 = (long)(dVar15 - 9.223372036854776e+18) & (long)dVar15 >> 0x3f | (long)dVar15,
        uVar5 < uVar1 * 2) {
    dVar15 = exp2((double)iVar10);
    iVar10 = iVar10 + 1;
  }
  pdVar14 = (this->dc).super__Vector_base<dict,_std::allocator<dict>_>._M_impl.
            super__Vector_impl_data._M_start;
  *(ulong *)((long)(pdVar14[dictidx].ht + 1) + 8) = uVar5;
  *(ulong *)((long)(pdVar14[dictidx].ht + 1) + 0x10) = uVar5 - 1;
  uVar12 = 0;
  pvVar6 = operator_new__(-(ulong)(uVar5 >> 0x3d != 0) | uVar5 << 3);
  pdVar14[dictidx].ht[1].table = (dictEntry **)pvVar6;
  while( true ) {
    uVar5 = pdVar14[dictidx].ht[0].size;
    if (uVar5 <= uVar12) break;
    ppdVar13 = pdVar14[dictidx].ht[0].table + uVar12;
    while (pdVar11 = *ppdVar13, pdVar11 != (dictEntry *)0x0) {
      uVar4 = (*((this->dc).super__Vector_base<dict,_std::allocator<dict>_>._M_impl.
                 super__Vector_impl_data._M_start[dictidx].type)->hashFunction)(pdVar11->key);
      pdVar14 = (this->dc).super__Vector_base<dict,_std::allocator<dict>_>._M_impl.
                super__Vector_impl_data._M_start;
      lVar9 = (long)pdVar14[dictidx].ht[1].table;
      lVar7 = (long)(int)(uVar4 & *(uint *)((long)(pdVar14[dictidx].ht + 1) + 0x10));
      lVar2 = *(long *)(lVar9 + lVar7 * 8);
      if (lVar2 == 0) {
        plVar8 = (long *)(lVar9 + lVar7 * 8);
      }
      else {
        do {
          lVar9 = lVar2;
          lVar2 = *(long *)(lVar9 + 0x10);
        } while (lVar2 != 0);
        plVar8 = (long *)(lVar9 + 0x10);
      }
      *plVar8 = (long)pdVar11;
      ppdVar13 = &pdVar11->next;
    }
    uVar12 = uVar12 + 1;
    pdVar14 = (this->dc).super__Vector_base<dict,_std::allocator<dict>_>._M_impl.
              super__Vector_impl_data._M_start;
  }
  uVar12 = 0;
  while( true ) {
    if (uVar5 <= uVar12) break;
    pdVar11 = pdVar14[dictidx].ht[0].table[uVar12];
    while (pdVar11 != (dictEntry *)0x0) {
      pdVar3 = pdVar11->next;
      operator_delete(pdVar11);
      pdVar11 = pdVar3;
    }
    uVar12 = uVar12 + 1;
    pdVar14 = (this->dc).super__Vector_base<dict,_std::allocator<dict>_>._M_impl.
              super__Vector_impl_data._M_start;
    uVar5 = pdVar14[dictidx].ht[0].size;
  }
  ht = pdVar14[dictidx].ht + 1;
  this_00 = (dic *)pdVar14[dictidx].ht;
  dictht::operator=((dictht *)this_00,ht);
  dictidx_00 = (int)ht;
  iVar10 = (this_00->dc).super__Vector_base<dict,_std::allocator<dict>_>._M_impl.
           super__Vector_impl_data._M_start[dictidx_00].rehashidx;
  pvVar6 = dict_find(this_00,dictidx_00,0,key);
  if (iVar10 != -1) {
    if (pvVar6 != (void *)0x0) goto LAB_0010889a;
    pvVar6 = dict_find(this_00,dictidx_00,1,key);
  }
  if (pvVar6 == (void *)0x0) {
    return 0;
  }
LAB_0010889a:
  return (int)*(undefined8 *)((long)pvVar6 + 8);
}

Assistant:

int dic::rehash(int dictidx){
    int i=1,index;
    dictEntry *tmp=NULL;
    dc[dictidx].type->hashFunction=dic::murmurhash2;
    unsigned long newsize=dc[dictidx].ht[0].size*2;
    unsigned long tmpsize=pow(2,i);
    while(newsize>tmpsize){
        tmpsize=pow(2,++i);
    }
    newsize=tmpsize;

    dc[dictidx].ht[1].size=newsize;
    dc[dictidx].ht[1].sizemask=newsize-1;
    dc[dictidx].ht[1].table=new dictEntry*[newsize];

    dictEntry *fetch=NULL;
    for(unsigned int i=0;i<dc[dictidx].ht[0].size;i++){
        fetch=dc[dictidx].ht[0].table[i];
        while(fetch!=NULL){
            index=dc[dictidx].type->hashFunction(fetch->key)&dc[dictidx].ht[1].sizemask;
            tmp=dc[dictidx].ht[1].table[index];
            if(tmp==NULL)
                dc[dictidx].ht[1].table[index]=fetch;
            else
            {
                while(tmp->next!=NULL){
                    tmp=tmp->next;
                }
                tmp->next=fetch;
            }
            fetch=fetch->next;
        }
    }
    //ht[0] -> ht[1] done

    //relese ht[0]
    fetch=tmp=NULL;    
    for(unsigned int i=0;i<dc[dictidx].ht[0].size;i++){
        fetch=dc[dictidx].ht[0].table[i];
        while(fetch!=NULL){
            tmp=fetch;
            fetch=fetch->next;
            delete tmp;
            tmp=NULL;
        }
    }  

    //override =
    dc[dictidx].ht[0]=dc[dictidx].ht[1];


    dictht *newht=NULL;
    newht->table=NULL;
    newht->size=0;
    newht->sizemask=0;
    newht->used=0;
    dc[dictidx].ht[1]=*newht;

    return 1;
}